

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

bool NULLCError::try_0(NULLCRef function,NULLCArray *message,NULLCRef *exception,NULLCRef *result)

{
  nullres nVar1;
  ExternTypeInfo *pEVar2;
  size_t sVar3;
  char *pcVar4;
  NULLCArray NVar5;
  undefined8 local_34;
  undefined4 local_2c;
  
  if (function.ptr == (char *)0x0) {
    pcVar4 = "ERROR: null pointer access";
  }
  else {
    pEVar2 = nullcDebugTypeInfo((uint *)0x0);
    if (pEVar2[function.typeID].subCat == CAT_FUNCTION) {
      if (pEVar2[function.typeID].field_8.arrSize < 2) {
        nVar1 = nullcCallFunction(*(undefined8 *)function.ptr,(ulong)*(uint *)(function.ptr + 8));
        if (nVar1 == '\0') {
          if (message != (NULLCArray *)0x0) {
            pcVar4 = nullcGetLastError();
            sVar3 = strlen(pcVar4);
            NVar5 = nullcAllocateArrayTyped(2,(int)sVar3 + 1);
            *message = NVar5;
            strcpy(NVar5.ptr,pcVar4);
          }
          nullcGetLastErrorObject();
          *(undefined4 *)((long)&exception->ptr + 4) = local_2c;
          *(undefined8 *)exception = local_34;
          nullcClearError();
          return false;
        }
        if (result == (NULLCRef *)0x0) {
          return true;
        }
        nullcGetResultObject();
        *(undefined4 *)((long)&result->ptr + 4) = local_2c;
        *(undefined8 *)result = local_34;
        return true;
      }
      pcVar4 = "ERROR: can\'t call function with arguments";
    }
    else {
      pcVar4 = "ERROR: argument is not a function";
    }
  }
  nullcThrowError(pcVar4);
  return false;
}

Assistant:

bool try_0(NULLCRef function, NULLCArray* message, NULLCRef* exception, NULLCRef* result)
	{
		if(!function.ptr)
		{
			nullcThrowError("ERROR: null pointer access");
			return false;
		}

		ExternTypeInfo *exTypes = nullcDebugTypeInfo(NULL);

		if(exTypes[function.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("ERROR: argument is not a function");
			return false;
		}

		if(exTypes[function.typeID].memberCount > 1)
		{
			nullcThrowError("ERROR: can't call function with arguments");
			return false;
		}

		NULLCFuncPtr functionValue = *(NULLCFuncPtr*)function.ptr;

		if(!nullcCallFunction(functionValue))
		{
			if(message)
			{
				const char *rawMessage = nullcGetLastError();
				unsigned rawLength = unsigned(strlen(rawMessage));

				*message = nullcAllocateArrayTyped(NULLC_TYPE_CHAR, rawLength + 1);
				strcpy(message->ptr, rawMessage);
			}

			*exception = nullcGetLastErrorObject();

			nullcClearError();
			return false;
		}

		if(result)
			*result = nullcGetResultObject();

		return true;
	}